

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Anytest_TreatAsSet_Test::TestBody(Anytest_TreatAsSet_Test *this)

{
  bool bVar1;
  Any *pAVar2;
  FieldDescriptor *field;
  char *message;
  char *in_R9;
  string local_380;
  AssertHelper local_360;
  Message local_358;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_;
  string local_330;
  undefined1 local_310 [8];
  MessageDifferencer message_differencer;
  TestAny m2;
  TestAny m1;
  undefined1 local_c0 [8];
  TestField value2;
  TestField value1;
  Anytest_TreatAsSet_Test *this_local;
  
  proto2_unittest::TestField::TestField((TestField *)((long)&value2.field_0 + 0x40));
  proto2_unittest::TestField::TestField((TestField *)local_c0);
  proto2_unittest::TestField::set_a((TestField *)((long)&value2.field_0 + 0x40),0x14);
  proto2_unittest::TestField::set_b((TestField *)((long)&value2.field_0 + 0x40),0x1e);
  proto2_unittest::TestField::set_a((TestField *)local_c0,0x14);
  proto2_unittest::TestField::set_b((TestField *)local_c0,0x1f);
  proto2_unittest::TestAny::TestAny((TestAny *)((long)&m2.field_0 + 0x30));
  proto2_unittest::TestAny::TestAny((TestAny *)&message_differencer.unpack_any_field_);
  pAVar2 = proto2_unittest::TestAny::add_repeated_any_value((TestAny *)((long)&m2.field_0 + 0x30));
  Any::PackFrom(pAVar2,(Message *)((long)&value2.field_0 + 0x40));
  pAVar2 = proto2_unittest::TestAny::add_repeated_any_value((TestAny *)((long)&m2.field_0 + 0x30));
  Any::PackFrom(pAVar2,(Message *)local_c0);
  pAVar2 = proto2_unittest::TestAny::add_repeated_any_value
                     ((TestAny *)&message_differencer.unpack_any_field_);
  Any::PackFrom(pAVar2,(Message *)local_c0);
  pAVar2 = proto2_unittest::TestAny::add_repeated_any_value
                     ((TestAny *)&message_differencer.unpack_any_field_);
  Any::PackFrom(pAVar2,(Message *)((long)&value2.field_0 + 0x40));
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)local_310);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,"repeated_any_value",
             (allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  field = GetFieldDescriptor((Message *)((long)&m2.field_0 + 0x30),&local_330);
  util::MessageDifferencer::TreatAsSet((MessageDifferencer *)local_310,field);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&gtest_ar_.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 7));
  local_349 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)local_310,(Message *)((long)&m2.field_0 + 0x30),
                         (Message *)&message_differencer.unpack_any_field_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_348,&local_349,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_380,(internal *)local_348,
               (AssertionResult *)"message_differencer.Compare(m1, m2)","false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x10dd,message);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    std::__cxx11::string::~string((string *)&local_380);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)local_310);
  proto2_unittest::TestAny::~TestAny((TestAny *)&message_differencer.unpack_any_field_);
  proto2_unittest::TestAny::~TestAny((TestAny *)((long)&m2.field_0 + 0x30));
  proto2_unittest::TestField::~TestField((TestField *)local_c0);
  proto2_unittest::TestField::~TestField((TestField *)((long)&value2.field_0 + 0x40));
  return;
}

Assistant:

TEST(Anytest, TreatAsSet) {
  proto2_unittest::TestField value1, value2;
  value1.set_a(20);
  value1.set_b(30);
  value2.set_a(20);
  value2.set_b(31);

  proto2_unittest::TestAny m1, m2;
  m1.add_repeated_any_value()->PackFrom(value1);
  m1.add_repeated_any_value()->PackFrom(value2);
  m2.add_repeated_any_value()->PackFrom(value2);
  m2.add_repeated_any_value()->PackFrom(value1);

  util::MessageDifferencer message_differencer;
  message_differencer.TreatAsSet(GetFieldDescriptor(m1, "repeated_any_value"));
  EXPECT_TRUE(message_differencer.Compare(m1, m2));
}